

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O2

void temp_load(TCGContext_conflict9 *s,TCGTemp *ts,TCGRegSet desired_regs,TCGRegSet allocated_regs,
              TCGRegSet preferred_regs)

{
  undefined8 uVar1;
  uint uVar2;
  TCGReg ret;
  ulong uVar3;
  uint uVar4;
  
  uVar1 = *(undefined8 *)ts;
  if ((char)((ulong)uVar1 >> 8) != '\x01') {
    uVar4 = (uint)((ulong)uVar1 >> 8) & 0xff;
    uVar2 = (uint)((ulong)uVar1 >> 0x20);
    if (uVar4 == 2) {
      ret = tcg_reg_alloc(s,desired_regs,allocated_regs,preferred_regs,
                          (_Bool)((byte)(uVar2 >> 2) & 1));
      tcg_out_ld(s,(uint)(byte)ts->field_0x3,ret,(uint)*(byte *)ts->mem_base,ts->mem_offset);
      uVar3 = *(ulong *)ts | 0x800000000;
    }
    else {
      if (uVar4 != 3) {
        fprintf(_stderr,"%s:%d: tcg fatal error\n",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
                ,0xc03);
        abort();
      }
      ret = tcg_reg_alloc(s,desired_regs,allocated_regs,preferred_regs,
                          (_Bool)((byte)(uVar2 >> 2) & 1));
      tcg_out_movi(s,(uint)(byte)ts->field_0x3,ret,ts->val);
      uVar3 = *(ulong *)ts & 0xfffffff7ffffffff;
    }
    *(ulong *)ts = (uVar3 & 0xffffffffffff0000) + (ulong)(byte)ret + 0x100;
    s->reg_to_temp[ret] = ts;
  }
  return;
}

Assistant:

static void temp_load(TCGContext *s, TCGTemp *ts, TCGRegSet desired_regs,
                      TCGRegSet allocated_regs, TCGRegSet preferred_regs)
{
    TCGReg reg;

    switch (ts->val_type) {
    case TEMP_VAL_REG:
        return;
    case TEMP_VAL_CONST:
        reg = tcg_reg_alloc(s, desired_regs, allocated_regs,
                            preferred_regs, ts->indirect_base);
        tcg_out_movi(s, ts->type, reg, ts->val);
        ts->mem_coherent = 0;
        break;
    case TEMP_VAL_MEM:
        reg = tcg_reg_alloc(s, desired_regs, allocated_regs,
                            preferred_regs, ts->indirect_base);
        tcg_out_ld(s, ts->type, reg, ts->mem_base->reg, ts->mem_offset);
        ts->mem_coherent = 1;
        break;
    case TEMP_VAL_DEAD:
    default:
        tcg_abort();
    }
    ts->reg = reg;
    ts->val_type = TEMP_VAL_REG;
    s->reg_to_temp[reg] = ts;
}